

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

Move<vk::VkDevice_s_*> *
vkt::wsi::anon_unknown_0::createDeviceWithWsi
          (Move<vk::VkDevice_s_*> *__return_storage_ptr__,InstanceInterface *vki,
          VkPhysicalDevice physicalDevice,Extensions *supportedExtensions,deUint32 queueFamilyIndex,
          bool requiresDisplayTiming,VkAllocationCallbacks *pAllocator)

{
  bool bVar1;
  NotSupportedError *this;
  char *pcVar2;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  Maybe<unsigned_int> local_240;
  Maybe<unsigned_int> local_230 [2];
  allocator<char> local_209;
  string local_208;
  RequiredExtension local_1e8;
  int local_1a4;
  undefined1 local_1a0 [4];
  int ndx;
  VkDeviceCreateInfo deviceParams;
  char *extensions [2];
  VkPhysicalDeviceFeatures features;
  VkDeviceQueueCreateInfo queueInfos [1];
  float queuePriorities [1];
  bool requiresDisplayTiming_local;
  deUint32 queueFamilyIndex_local;
  Extensions *supportedExtensions_local;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  
  features.variableMultisampleRate = 2;
  getDeviceNullFeatures();
  deviceParams.pEnabledFeatures = (VkPhysicalDeviceFeatures *)anon_var_dwarf_21c535;
  extensions[0] = "VK_GOOGLE_display_timing";
  local_1a0 = (undefined1  [4])0x3;
  deviceParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceParams._4_4_ = 0;
  deviceParams.pNext._0_4_ = 0;
  deviceParams.pNext._4_4_ = 1;
  deviceParams._16_8_ = &features.variableMultisampleRate;
  deviceParams.pQueueCreateInfos._0_4_ = 0;
  deviceParams.enabledLayerCount = 0;
  deviceParams._36_4_ = 0;
  deviceParams.ppEnabledLayerNames._0_4_ = 1;
  if (requiresDisplayTiming) {
    deviceParams.ppEnabledLayerNames._0_4_ = 2;
  }
  deviceParams._48_8_ = &deviceParams.pEnabledFeatures;
  deviceParams.ppEnabledExtensionNames = (char **)((long)extensions + 0xc);
  local_1a4 = 0;
  while( true ) {
    if (1 < local_1a4) {
      ::vk::createDevice(__return_storage_ptr__,vki,physicalDevice,(VkDeviceCreateInfo *)local_1a0,
                         pAllocator);
      return __return_storage_ptr__;
    }
    pcVar2 = extensions[(long)local_1a4 + -1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,pcVar2,&local_209);
    tcu::nothing<unsigned_int>();
    tcu::nothing<unsigned_int>();
    ::vk::RequiredExtension::RequiredExtension(&local_1e8,&local_208,local_230,&local_240);
    bVar1 = ::vk::isExtensionSupported(supportedExtensions,&local_1e8);
    ::vk::RequiredExtension::~RequiredExtension(&local_1e8);
    tcu::Maybe<unsigned_int>::~Maybe(&local_240);
    tcu::Maybe<unsigned_int>::~Maybe(local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    local_1a4 = local_1a4 + 1;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  pcVar2 = extensions[(long)local_1a4 + -1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,pcVar2,&local_281);
  std::operator+(&local_260,&local_280," is not supported");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tcu::NotSupportedError::NotSupportedError
            (this,pcVar2,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
             ,0xac);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

vk::Move<vk::VkDevice> createDeviceWithWsi (const vk::InstanceInterface&		vki,
											vk::VkPhysicalDevice				physicalDevice,
											const Extensions&					supportedExtensions,
											const deUint32						queueFamilyIndex,
											bool								requiresDisplayTiming,
											const vk::VkAllocationCallbacks*	pAllocator = DE_NULL)
{
	const float							queuePriorities[]	= { 1.0f };
	const vk::VkDeviceQueueCreateInfo	queueInfos[]		=
	{
		{
			vk::VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
			DE_NULL,
			(vk::VkDeviceQueueCreateFlags)0,
			queueFamilyIndex,
			DE_LENGTH_OF_ARRAY(queuePriorities),
			&queuePriorities[0]
		}
	};
	const vk::VkPhysicalDeviceFeatures	features		= getDeviceNullFeatures();
	const char* const					extensions[]	=
	{
		"VK_KHR_swapchain",
		"VK_GOOGLE_display_timing"
	};

	const vk::VkDeviceCreateInfo		deviceParams	=
	{
		vk::VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,
		DE_NULL,
		(vk::VkDeviceCreateFlags)0,
		DE_LENGTH_OF_ARRAY(queueInfos),
		&queueInfos[0],
		0u,
		DE_NULL,
		requiresDisplayTiming ? 2u : 1u,
		DE_ARRAY_BEGIN(extensions),
		&features
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(extensions); ++ndx)
	{
		if (!isExtensionSupported(supportedExtensions, vk::RequiredExtension(extensions[ndx])))
			TCU_THROW(NotSupportedError, (string(extensions[ndx]) + " is not supported").c_str());
	}

	return createDevice(vki, physicalDevice, &deviceParams, pAllocator);
}